

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void basics(void)

{
  long lVar1;
  ostream *poVar2;
  int i;
  ulong uVar3;
  int in_stack_00000118;
  undefined4 local_7c;
  int badNums [5];
  int local_64;
  string bob;
  string thing;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Hello, bro World!");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string((string *)&thing,"thing",(allocator *)&bob);
  puts("HI person!");
  std::operator<<((ostream *)&std::cout,"Favorite number ");
  poVar2 = std::ostream::_M_insert<double>(3.141529083251953);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Size of double: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Size of char: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Size of bool: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Size of bool: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Size of int: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Size of float: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Size of double: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Largest possible int: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x7fffffff);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Largest possible int plus one: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,-0x80000000);
  poVar2 = std::operator<<(poVar2," causes code to break.");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"5 ++ = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,5);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"++ 5 = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,7);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"5 -- = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,7);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"-- 5 = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,5);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"num += 1: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"(1 + 3 * 5): ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x10);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"string: ");
  poVar2 = std::operator<<(poVar2,(string *)&thing);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"4 / 5 = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"4 / 5 = ");
  poVar2 = std::ostream::_M_insert<double>(0.800000011920929);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"4 / 5 = ");
  poVar2 = std::ostream::_M_insert<double>(0.8);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"4 / 5 = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"bigNum: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,5);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"bigNum: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
  std::endl<char,std::char_traits<char>>(poVar2);
  badNums[0] = 5;
  badNums[1] = 0xc;
  badNums[2] = 10;
  badNums[3] = 5;
  badNums[4] = 2;
  poVar2 = std::operator<<((ostream *)&std::cout,"bad numbers: ");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"bad numbers: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,badNums[1]);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"bad numbers: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_7c);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"bad numbers: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,badNums[4]);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"bad numbers: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_64);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"bad numbers: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_stack_00000118);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,7);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"static_cast<double> (25) = ");
  poVar2 = std::ostream::_M_insert<double>(25.0);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"static_cast<double> (5 + 3) = ");
  poVar2 = std::ostream::_M_insert<double>(8.0);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"static_cast<double> (15) / 2 = ");
  poVar2 = std::ostream::_M_insert<double>(7.5);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,7);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"static_cast<int> (\'A\') = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x41);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"static_cast<int> (\'B\') = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x42);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"static_cast<char> (65) = ");
  poVar2 = std::operator<<(poVar2,'A');
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x83);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x83);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string((string *)&bob,"Bob",(allocator *)((long)&local_7c + 3));
  poVar2 = std::operator<<((ostream *)&std::cout,"bob = ");
  poVar2 = std::operator<<(poVar2,(string *)&bob);
  std::endl<char,std::char_traits<char>>(poVar2);
  for (uVar3 = 0; uVar3 < bob._M_string_length; uVar3 = uVar3 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"bob[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar3);
    poVar2 = std::operator<<(poVar2,"] = ");
    poVar2 = std::operator<<(poVar2,bob._M_dataplus._M_p[uVar3]);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"\'2\' + \'B\' = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x74);
  std::endl<char,std::char_traits<char>>(poVar2);
  *(undefined8 *)(std::operator>> + *(long *)(std::cout + -0x18)) = 2;
  std::operator<<((ostream *)&std::cout,"Set precision(2) of 5.323 = ");
  poVar2 = std::ostream::_M_insert<double>(5.323);
  std::endl<char,std::char_traits<char>>(poVar2);
  *(undefined8 *)(std::operator>> + *(long *)(std::cout + -0x18)) = 1;
  std::operator<<((ostream *)&std::cout,"Set precision(1) of 5.323 = ");
  poVar2 = std::ostream::_M_insert<double>(5.323);
  std::endl<char,std::char_traits<char>>(poVar2);
  *(undefined8 *)
   (std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) = 0x1a;
  poVar2 = std::operator<<((ostream *)&std::cout,"H I J K L M N O P Q R S T");
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar1 = std::cout;
  *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) | 0x400;
  *(undefined8 *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(lVar1 + -0x18)) =
       10;
  poVar2 = std::ostream::_M_insert<double>(20.56);
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 10;
  poVar2 = std::ostream::_M_insert<double>(50.2);
  std::endl<char,std::char_traits<char>>(poVar2);
  *(undefined8 *)
   (std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) = 10;
  poVar2 = std::ostream::_M_insert<double>(20.56);
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 10;
  poVar2 = std::ostream::_M_insert<double>(50.2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<double>(2.54);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<double>(2.5399999618530273);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,5);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&bob);
  std::__cxx11::string::~string((string *)&thing);
  return;
}

Assistant:

void basics() {
    cout << "Hello, bro World!" << endl;
    const double PI = 3.1415926535;  // like float but usually accurate up to 15 digits. (8 bytes)
    char myGrade = 'A';  // 1 byte in memory
    bool isHappy = true;  // 1  (1 byte)
    bool isSad = false;  // 0  (1 byte)
    int myAge = 39;  // 4 bytes
    float favNum = 3.141529;  // 4 bytes
    double otherFavNum = 1.6180339887;  // 8 bytes.
    int largestInt = 2147483647;  // 2^31 since 4 bytes have 32 bits. 0 including reduces it to 31.
    int largestIntPlusOne = 2147483648;  // 2^31 since 4 bytes have 32 bits. 0 including reduces it to 31.
    int five = 5;
    int num = 10;
    num += 1;
    string thing = "thing";
    printf("HI person!\n");


    // =================== PRINT STUFF ========================
    cout << "Favorite number " << favNum << endl;
    cout << "Size of double: " << sizeof(PI) << endl;
    cout << "Size of char: " << sizeof(myGrade) << endl;
    cout << "Size of bool: " << sizeof(isHappy) << endl;
    cout << "Size of bool: " << sizeof(isSad) << endl;
    cout << "Size of int: " << sizeof(myAge) << endl;
    cout << "Size of float: " << sizeof(favNum) << endl;
    cout << "Size of double: " << sizeof(otherFavNum) << endl;
    cout << "Largest possible int: " << largestInt << endl;
    cout << "Largest possible int plus one: " << largestIntPlusOne << " causes code to break." << endl;
    cout << "5 ++ = " << five++ << endl;  // this increments 5 to 6  (increments AFTER).
    cout << "++ 5 = " << ++five << endl;  // this increments 6 by 1 equalling 7  (increments BEFORE).
    cout << "5 -- = " << five-- << endl;  //
    cout << "-- 5 = " << --five << endl;
    cout << "num += 1: " << num << endl;
    cout << "(1 + 3 * 5): " << 1 + 3 * 5 << endl;
    cout << "string: " << thing << endl;
    cout << "4 / 5 = " << 4 / 5 << endl;
    cout << "4 / 5 = " << (float) 4 / 5 << endl;  // how I wrote (float)... It is called casting.
    cout << "4 / 5 = " << (double) 4 / 5 << endl;  // how I wrote (double)... It is called casting.
    cout << "4 / 5 = " << (int) 4 / 5 << endl;  // how I wrote (int)... It is called casting.

    // ternary operator
    // variable = (condition) ? true : false
    int bigNum = (5 > 2) ? 5 : 2;
    cout << "bigNum: " << bigNum << endl;
    int bigNum2 = (1 > 2) ? 5 : 2;
    cout << "bigNum: " << bigNum2 << endl;

    // Arrays
    int array1[5];  // store 5 elements.
    int badNums[5] = {5, 12, 10, 5, 2};
    cout << "bad numbers: " << badNums << endl;
    cout << "bad numbers: " << badNums[1] << endl;
    cout << "bad numbers: " << badNums[-1] << endl;
    cout << "bad numbers: " << badNums[4] << endl;
    cout << "bad numbers: " << badNums[5] << endl;
    cout << "bad numbers: " << badNums[100] << endl;

    // Casting
    cout << static_cast<int> (7.9) << endl;

    cout << "static_cast<double> (25) = "
         << static_cast<double> (25) << endl;

    cout << "static_cast<double> (5 + 3) = "
         << static_cast<double> (5 + 3) << endl;

    cout << "static_cast<double> (15) / 2 = "
         << static_cast<double> (15) / 2 << endl;

    cout << (15) / 2 << endl;

    cout << "static_cast<int> ('A') = "
    << static_cast<int> ('A') << endl;

    cout << "static_cast<int> ('B') = "
    << static_cast<int> ('B') << endl;

    cout << "static_cast<char> (65) = "
    << static_cast<char> (65) << endl;

    cout << 'A' + 'B' << endl;
    cout << static_cast<int> ('A') + static_cast<int> ('B') << endl;

    string bob = "Bob";
    cout << "bob = " << bob << endl;
    for (int i = 0; i < bob.size(); i++) {
        cout << "bob[" << i << "] = " << bob[i] << endl;
    }

    char _num;
    _num = '2';
    cout << "'2' + 'B' = " << _num + 'B' << endl;
    cout << setprecision(2) << "Set precision(2) of 5.323 = " << 5.323 << endl;
    cout << setprecision(1) << "Set precision(1) of 5.323 = " << 5.323 << endl;
    cout << setw(26) << "H I J K L M N O P Q R S T" << endl;
    cout << std::fixed << std::showpoint;
    cout << setw(10) << 20.56 << setw(10) << 50.2 << endl;
    cout << setw(10) << 20.56 << setw(10) << 50.2 << endl;
    // Let's learn about CONSTANT values
    // const dataType identifier = value;
    const double CONVERSION_CENTIMETER = 2.54;
    const int NO_OF_STUDENTS = 20;
    const char BLANK = ' ';
    cout << CONVERSION_CENTIMETER << endl;
    const float CONVERSION = 2.54f;
    cout << CONVERSION << endl;
    cout << 5%7 << endl;
}